

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint Extra_TruthCanonNP(uint uTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar19;
  uint uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (Extra_TruthCanonNP::pPerms == (char **)0x0) {
    if (0 < nVars) {
      auVar16 = _DAT_008c1c20;
      iVar8 = 4;
      uVar7 = 1;
      uVar1 = 1;
      uVar2 = 1;
      uVar10 = 1;
      do {
        uVar14 = uVar10;
        uVar13 = uVar2;
        uVar12 = uVar1;
        uVar11 = uVar7;
        uVar7 = auVar16._0_4_ * uVar11;
        uVar2 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
        uVar1 = auVar16._4_4_ * uVar12;
        uVar10 = auVar16._12_4_ * uVar14;
        auVar18._0_4_ = auVar16._0_4_ + 4;
        auVar18._4_4_ = auVar16._4_4_ + 4;
        auVar18._8_4_ = auVar16._8_4_ + 4;
        auVar18._12_4_ = auVar16._12_4_ + 4;
        iVar3 = iVar8 + -4;
        iVar5 = iVar8 + (nVars + 3U & 0xfffffffc);
        auVar16 = auVar18;
        iVar8 = iVar3;
      } while (iVar5 != 8);
      goto LAB_00418752;
    }
LAB_004187a6:
    Extra_TruthCanonNP::nPerms = 1;
  }
  else {
    if (Extra_TruthCanonNP::nVarsOld == nVars) goto LAB_004187c5;
    free(Extra_TruthCanonNP::pPerms);
    Extra_TruthCanonNP::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_004187a6;
    auVar16 = _DAT_008c1c20;
    iVar8 = 4;
    uVar7 = 1;
    uVar1 = 1;
    uVar2 = 1;
    uVar10 = 1;
    do {
      uVar14 = uVar10;
      uVar13 = uVar2;
      uVar12 = uVar1;
      uVar11 = uVar7;
      uVar7 = auVar16._0_4_ * uVar11;
      uVar2 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
      uVar1 = auVar16._4_4_ * uVar12;
      uVar10 = auVar16._12_4_ * uVar14;
      auVar17._0_4_ = auVar16._0_4_ + 4;
      auVar17._4_4_ = auVar16._4_4_ + 4;
      auVar17._8_4_ = auVar16._8_4_ + 4;
      auVar17._12_4_ = auVar16._12_4_ + 4;
      iVar3 = iVar8 + -4;
      iVar5 = iVar8 + (nVars + 3U & 0xfffffffc);
      auVar16 = auVar17;
      iVar8 = iVar3;
    } while (iVar5 != 8);
LAB_00418752:
    uVar9 = nVars - 1;
    uVar4 = -iVar3;
    uVar15 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
    uVar19 = -(uint)((int)(nVars - 1U ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
    uVar20 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
    uVar4 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
    Extra_TruthCanonNP::nPerms =
         (~uVar20 & uVar2 | uVar13 & uVar20) * (~uVar15 & uVar7 | uVar11 & uVar15) *
         (~uVar19 & uVar1 | uVar12 & uVar19) * (~uVar4 & uVar10 | uVar14 & uVar4);
  }
  Extra_TruthCanonNP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNP::nVarsOld = nVars;
LAB_004187c5:
  uVar7 = 0xffffffff;
  if (nVars != 0x1f) {
    iVar8 = 0;
    do {
      uVar1 = Extra_TruthPolarize(uTruth,iVar8,nVars);
      if (0 < Extra_TruthCanonNP::nPerms) {
        lVar6 = 0;
        do {
          uVar2 = Extra_TruthPermute(uVar1,Extra_TruthCanonNP::pPerms[lVar6],nVars,0);
          if (uVar2 <= uVar7) {
            uVar7 = uVar2;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < Extra_TruthCanonNP::nPerms);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 1 << ((byte)nVars & 0x1f));
  }
  return uVar7;
}

Assistant:

unsigned Extra_TruthCanonNP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}